

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_query.cpp
# Opt level: O0

cmMakefile * __thiscall
cmakels::cmake_query::cmake_query::get_makefile(cmake_query *this,string *uri)

{
  bool bVar1;
  int iVar2;
  pointer this_00;
  cmGlobalGenerator *this_01;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *pvVar3;
  reference ppcVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  const_reference filename_00;
  string local_c8;
  cmMakefile *local_a8;
  cmMakefile *mf;
  iterator __end2;
  iterator __begin2;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *__range2;
  string local_78;
  undefined1 local_58 [8];
  string filename;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> mfs;
  string *uri_local;
  cmake_query *this_local;
  
  this_00 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->(&this->my_cmake);
  this_01 = cmake::GetGlobalGenerator(this_00);
  pvVar3 = cmGlobalGenerator::GetMakefiles(this_01);
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
            ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)((long)&filename.field_2 + 8),
             pvVar3);
  support::uri_to_filename(&local_78,uri);
  anon_unknown_4::normalize_filename((string *)local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  pvVar3 = (vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)((long)&filename.field_2 + 8);
  __end2 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::begin(pvVar3);
  mf = (cmMakefile *)std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::end(pvVar3);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
                                *)&mf);
    if (!bVar1) {
      this_local = (cmake_query *)0x0;
LAB_0013ebf7:
      std::__cxx11::string::~string((string *)local_58);
      std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~vector
                ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)
                 ((long)&filename.field_2 + 8));
      return (cmMakefile *)this_local;
    }
    ppcVar4 = __gnu_cxx::
              __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
              ::operator*(&__end2);
    local_a8 = *ppcVar4;
    this_02 = cmMakefile::GetListFiles_abi_cxx11_(local_a8);
    filename_00 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](this_02,0);
    anon_unknown_4::normalize_filename(&local_c8,filename_00);
    iVar2 = std::__cxx11::string::compare((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    if (iVar2 == 0) {
      this_local = (cmake_query *)local_a8;
      goto LAB_0013ebf7;
    }
    __gnu_cxx::
    __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>::
    operator++(&__end2);
  } while( true );
}

Assistant:

cmMakefile *cmake_query::get_makefile(std::string const &uri) {
  auto mfs = my_cmake->GetGlobalGenerator()->GetMakefiles();
  auto filename = normalize_filename(support::uri_to_filename(uri));
  for (auto mf : mfs) {
    if (normalize_filename(mf->GetListFiles()[0]).compare(filename) == 0) {
      return mf;
    }
  }
  return nullptr;
}